

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataPdu.cpp
# Opt level: O0

bool __thiscall DIS::DataPdu::operator==(DataPdu *this,DataPdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  const_reference this_01;
  const_reference rhs_01;
  ulong local_30;
  size_t idx_1;
  size_t idx;
  bool ivarsEqual;
  DataPdu *rhs_local;
  DataPdu *this_local;
  
  idx._7_1_ = SimulationManagementFamilyPdu::operator==
                        (&this->super_SimulationManagementFamilyPdu,
                         &rhs->super_SimulationManagementFamilyPdu);
  if (this->_requestID != rhs->_requestID) {
    idx._7_1_ = false;
  }
  if (this->_padding1 != rhs->_padding1) {
    idx._7_1_ = false;
  }
  idx_1 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                      (&this->_fixedDatums);
    if (sVar2 <= idx_1) break;
    this_00 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                        (&this->_fixedDatums,idx_1);
    rhs_00 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                       (&rhs->_fixedDatums,idx_1);
    bVar1 = FixedDatum::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    idx_1 = idx_1 + 1;
  }
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                      (&this->_variableDatums);
    if (sVar2 <= local_30) break;
    this_01 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                        (&this->_variableDatums,local_30);
    rhs_01 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&rhs->_variableDatums,local_30);
    bVar1 = VariableDatum::operator==(this_01,rhs_01);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_30 = local_30 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool DataPdu::operator ==(const DataPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _fixedDatums.size(); idx++)
     {
        if( ! ( _fixedDatums[idx] == rhs._fixedDatums[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatums.size(); idx++)
     {
        if( ! ( _variableDatums[idx] == rhs._variableDatums[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }